

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *structNode,Reader *replacement,uint64_t scopeId,
          uint64_t replacementScopeId)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  ElementCount EVar5;
  ushort uVar6;
  ushort uVar7;
  uint i;
  ElementCount index;
  Reader *this_00;
  uint64_t replacementScopeId_local;
  uint64_t scopeId_local;
  Reader fields;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition_1;
  Reader replacementFields;
  Fault f_1;
  
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x80) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x80) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
  }
  replacementScopeId_local = replacementScopeId;
  scopeId_local = scopeId;
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x80) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0xe);
    }
    if (uVar2 < 0x80) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0xe);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0xd0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0xd0) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0xd0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x18);
    }
    if (uVar2 < 0xd0) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x18);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if (uVar1 < 0x100) {
    uVar6 = 0;
  }
  else {
    uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
  }
  uVar2 = (structNode->_reader).dataSize;
  if (uVar2 < 0x100) {
    uVar7 = 0;
  }
  else {
    uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
  }
  if (uVar7 < uVar6) {
    replacementIsNewer(this);
  }
  else {
    if (uVar1 < 0x100) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)((long)(replacement->_reader).data + 0x1e);
    }
    if (uVar2 < 0x100) {
      uVar7 = 0;
    }
    else {
      uVar7 = *(ushort *)((long)(structNode->_reader).data + 0x1e);
    }
    if (uVar6 < uVar7) {
      replacementIsOlder(this);
    }
  }
  uVar1 = (replacement->_reader).dataSize;
  if ((((0xff < uVar1) &&
       (pvVar3 = (replacement->_reader).data, *(short *)((long)pvVar3 + 0x1e) != 0)) &&
      (uVar2 = (structNode->_reader).dataSize, 0xff < uVar2)) &&
     (pvVar4 = (structNode->_reader).data, *(short *)((long)pvVar4 + 0x1e) != 0)) {
    fields.reader.segment._4_4_ = 0;
    fields.reader.segment._0_4_ = 0;
    if (0x11f < uVar1) {
      fields.reader.segment._0_4_ = *(int *)((long)pvVar3 + 0x20);
    }
    if (0x11f < uVar2) {
      fields.reader.segment._4_4_ = *(int *)((long)pvVar4 + 0x20);
    }
    fields.reader.capTable = (CapTableReader *)anon_var_dwarf_1f258;
    fields.reader.ptr = (byte *)0x5;
    fields.reader.elementCount =
         CONCAT31(fields.reader.elementCount._1_3_,
                  (int)fields.reader.segment == fields.reader.segment._4_4_);
    if ((int)fields.reader.segment != fields.reader.segment._4_4_) {
      this_00 = &replacementFields;
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[36]>
                ((Fault *)this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0x2f9,FAILED,
                 "replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset()",
                 "_kjCondition,\"union discriminant position changed\"",
                 (DebugComparison<unsigned_int,_unsigned_int> *)&fields,
                 (char (*) [36])"union discriminant position changed");
      goto LAB_0016c4d5;
    }
  }
  capnp::schema::Node::Struct::Reader::getFields(&fields,structNode);
  capnp::schema::Node::Struct::Reader::getFields(&replacementFields,replacement);
  EVar5 = replacementFields.reader.elementCount;
  if (fields.reader.elementCount < replacementFields.reader.elementCount) {
    EVar5 = fields.reader.elementCount;
  }
  if (fields.reader.elementCount < replacementFields.reader.elementCount) {
    replacementIsNewer(this);
  }
  else if (replacementFields.reader.elementCount < fields.reader.elementCount) {
    replacementIsOlder(this);
  }
  for (index = 0; EVar5 != index; index = index + 1) {
    capnp::_::ListReader::getStructElement((StructReader *)&_kjCondition_1,&fields.reader,index);
    capnp::_::ListReader::getStructElement((StructReader *)&f_1,&replacementFields.reader,index);
    checkCompatibility(this,(Reader *)&_kjCondition_1,(Reader *)&f_1);
  }
  if (((structNode->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(structNode->_reader).data + 0x1c) & 1) == 0)) {
    if ((replacement->_reader).dataSize < 0xe1) {
      return;
    }
    if ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0) {
      return;
    }
    replacementIsNewer(this);
    return;
  }
  if (((replacement->_reader).dataSize < 0xe1) ||
     ((*(byte *)((long)(replacement->_reader).data + 0x1c) & 1) == 0)) {
    replacementIsOlder(this);
    return;
  }
  _kjCondition_1.left = &replacementScopeId_local;
  _kjCondition_1.right = &scopeId_local;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  _kjCondition_1.result = replacementScopeId == scopeId;
  if (_kjCondition_1.result) {
    return;
  }
  this_00 = (Reader *)&f_1;
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&,char_const(&)[27]>
            ((Fault *)this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x314,FAILED,"replacementScopeId == scopeId",
             "_kjCondition,\"group node\'s scope changed\"",&_kjCondition_1,
             (char (*) [27])"group node\'s scope changed");
LAB_0016c4d5:
  this->compatibility = INCOMPATIBLE;
  kj::_::Debug::Fault::~Fault((Fault *)this_00);
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Struct::Reader& structNode,
                          const schema::Node::Struct::Reader& replacement,
                          uint64_t scopeId, uint64_t replacementScopeId) {
    if (replacement.getDataWordCount() > structNode.getDataWordCount()) {
      replacementIsNewer();
    } else if (replacement.getDataWordCount() < structNode.getDataWordCount()) {
      replacementIsOlder();
    }
    if (replacement.getPointerCount() > structNode.getPointerCount()) {
      replacementIsNewer();
    } else if (replacement.getPointerCount() < structNode.getPointerCount()) {
      replacementIsOlder();
    }
    if (replacement.getDiscriminantCount() > structNode.getDiscriminantCount()) {
      replacementIsNewer();
    } else if (replacement.getDiscriminantCount() < structNode.getDiscriminantCount()) {
      replacementIsOlder();
    }

    if (replacement.getDiscriminantCount() > 0 && structNode.getDiscriminantCount() > 0) {
      VALIDATE_SCHEMA(replacement.getDiscriminantOffset() == structNode.getDiscriminantOffset(),
                      "union discriminant position changed");
    }

    // The shared members should occupy corresponding positions in the member lists, since the
    // lists are sorted by ordinal.
    auto fields = structNode.getFields();
    auto replacementFields = replacement.getFields();
    uint count = kj::min(fields.size(), replacementFields.size());

    if (replacementFields.size() > fields.size()) {
      replacementIsNewer();
    } else if (replacementFields.size() < fields.size()) {
      replacementIsOlder();
    }

    for (uint i = 0; i < count; i++) {
      checkCompatibility(fields[i], replacementFields[i]);
    }

    // For the moment, we allow "upgrading" from non-group to group, mainly so that the
    // placeholders we generate for group parents (which in the absence of more info, we assume to
    // be non-groups) can be replaced with groups.
    //
    // TODO(cleanup):  The placeholder approach is really breaking down.  Maybe we need to maintain
    //   a list of expectations for nodes we haven't loaded yet.
    if (structNode.getIsGroup()) {
      if (replacement.getIsGroup()) {
        VALIDATE_SCHEMA(replacementScopeId == scopeId, "group node's scope changed");
      } else {
        replacementIsOlder();
      }
    } else {
      if (replacement.getIsGroup()) {
        replacementIsNewer();
      }
    }
  }